

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCommandBuffersTests.cpp
# Opt level: O2

TestStatus *
vkt::api::anon_unknown_0::createPoolNonNullAllocatorTest
          (TestStatus *__return_storage_ptr__,Context *context)

{
  deUint32 dVar1;
  VkDevice device;
  DeviceInterface *vk;
  VkAllocationCallbacks *pAllocator;
  VkCommandPoolCreateInfo cmdPoolParams;
  allocator<char> local_81;
  string local_80;
  VkCommandPoolCreateInfo local_60;
  RefBase<vk::Handle<(vk::HandleType)24>_> local_48;
  
  device = Context::getDevice(context);
  vk = Context::getDeviceInterface(context);
  dVar1 = Context::getUniversalQueueFamilyIndex(context);
  pAllocator = ::vk::getSystemAllocator();
  local_60.sType = VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO;
  local_60.pNext = (void *)0x0;
  local_60.flags = 0;
  local_60.queueFamilyIndex = dVar1;
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&local_48,vk,device,&local_60,pAllocator);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase(&local_48);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"Command Pool allocated correctly.",&local_81);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createPoolNonNullAllocatorTest(Context& context)
{
	const VkDevice							vkDevice				= context.getDevice();
	const DeviceInterface&					vk						= context.getDeviceInterface();
	const deUint32							queueFamilyIndex		= context.getUniversalQueueFamilyIndex();
	const VkAllocationCallbacks*			allocationCallbacks		= getSystemAllocator();

	const VkCommandPoolCreateInfo			cmdPoolParams			=
	{
		VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO,					// sType;
		DE_NULL,													// pNext;
		0u,															// flags;
		queueFamilyIndex,											// queueFamilyIndex;
	};

	createCommandPool(vk, vkDevice, &cmdPoolParams, allocationCallbacks);

	return tcu::TestStatus::pass("Command Pool allocated correctly.");
}